

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall
QGraphicsScenePrivate::processDirtyItemsRecursive
          (QGraphicsScenePrivate *this,QGraphicsItem *item,bool dirtyAncestorContainsChildren,
          qreal parentOpacity)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  QGraphicsScene *parentOpacity_00;
  QGraphicsItemPrivate *pQVar6;
  QGraphicsViewPrivate *this_00;
  QRect *pQVar7;
  QGraphicsItem **ppQVar8;
  const_iterator o;
  byte in_DL;
  QGraphicsScenePrivate *in_RSI;
  QGraphicsViewPrivate *in_RDI;
  long in_FS_OFFSET;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  byte bVar12;
  byte bVar13;
  undefined8 in_XMM0_Qa;
  qreal opacity_00;
  QGraphicsView *view_2;
  add_const_t<QList<QGraphicsView_*>_> *__range3_2;
  QGraphicsItem *child;
  add_const_t<QList<QGraphicsItem_*>_> *__range2;
  bool parentIgnoresOpacity;
  bool parentIgnoresVisible;
  bool allChildrenDirty;
  QGraphicsView *view_1;
  add_const_t<QList<QGraphicsView_*>_> *__range3_1;
  bool bypassUpdateClip;
  bool itemClipsChildrenToShape;
  QRect *paintedViewBoundingRect;
  QGraphicsViewPrivate *viewPrivate;
  QGraphicsView *view;
  add_const_t<QList<QGraphicsView_*>_> *__range3;
  bool uninitializedDirtyRect;
  bool useCompatUpdate;
  bool wasDirtyParentViewBoundingRects;
  bool itemIsUntransformable;
  bool wasDirtyParentSceneTransform;
  bool itemIsFullyTransparent;
  qreal opacity;
  bool itemHasChildren;
  bool itemHasContents;
  bool itemIsHidden;
  QGraphicsScene *q;
  const_iterator __end3_2;
  const_iterator __begin3_2;
  const_iterator __end2;
  const_iterator __begin2;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  const_iterator __end3;
  const_iterator __begin3;
  QRectF dirtyRect;
  QRectF rect;
  QRectF itemBoundingRect;
  int in_stack_fffffffffffffd78;
  int in_stack_fffffffffffffd7c;
  int in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffd84;
  byte in_stack_fffffffffffffd85;
  undefined1 in_stack_fffffffffffffd86;
  undefined1 uVar14;
  undefined1 in_stack_fffffffffffffd87;
  QGraphicsViewPrivate *in_stack_fffffffffffffd88;
  QGraphicsScenePrivate *in_stack_fffffffffffffd90;
  byte local_259;
  QGraphicsItem *in_stack_fffffffffffffdb0;
  undefined6 in_stack_fffffffffffffdb8;
  undefined1 uVar15;
  byte bVar16;
  QGraphicsScene *in_stack_fffffffffffffdc8;
  undefined8 in_stack_fffffffffffffdd8;
  QGraphicsItem *pQVar17;
  QRectF *in_stack_fffffffffffffde0;
  undefined5 in_stack_fffffffffffffde8;
  undefined1 in_stack_fffffffffffffded;
  undefined1 in_stack_fffffffffffffdee;
  undefined1 in_stack_fffffffffffffdef;
  QGraphicsViewPrivate *in_stack_fffffffffffffdf0;
  undefined7 in_stack_fffffffffffffe50;
  const_iterator local_188;
  QGraphicsItem **local_180;
  const_iterator local_178;
  const_iterator local_170;
  QGraphicsView **local_168;
  const_iterator local_160;
  const_iterator local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 local_140;
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  QGraphicsView **local_120;
  const_iterator local_118;
  const_iterator local_110;
  QRectF local_108;
  QRectF local_e8 [2];
  qreal local_a8;
  qreal local_a0;
  qreal local_98;
  qreal local_90;
  undefined1 local_88 [32];
  undefined1 local_68 [32];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_DL & 1;
  parentOpacity_00 = q_func((QGraphicsScenePrivate *)in_RDI);
  pQVar6 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       *)&in_RSI->field_0x8);
  if (((*(ulong *)&pQVar6->field_0x160 >> 0x19 & 1) == 0) &&
     (pQVar6 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                           *)&in_RSI->field_0x8), (*(ulong *)&pQVar6->field_0x160 >> 0x1a & 1) == 0)
     ) {
    resetDirtyItem(in_stack_fffffffffffffd90,(QGraphicsItem *)in_stack_fffffffffffffd88,
                   (bool)in_stack_fffffffffffffd87);
    goto LAB_009c2d47;
  }
  pQVar6 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       *)&in_RSI->field_0x8);
  bVar16 = 0;
  if (((uint)((ulong)*(undefined8 *)&pQVar6->field_0x160 >> 0x39) & 1) == 0) {
    pQVar6 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)&in_RSI->field_0x8);
    bVar16 = (*(ulong *)&pQVar6->field_0x160 >> 5 & 1) != 0 ^ 0xff;
  }
  if ((bVar16 & 1) != 0) {
    resetDirtyItem(in_stack_fffffffffffffd90,(QGraphicsItem *)in_stack_fffffffffffffd88,
                   (bool)in_stack_fffffffffffffd87);
    goto LAB_009c2d47;
  }
  pQVar6 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       *)&in_RSI->field_0x8);
  bVar9 = (*(ulong *)&pQVar6->field_0x160 & 0x40000000000) == 0;
  QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
            ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_> *)
             &in_RSI->field_0x8);
  bVar2 = QList<QGraphicsItem_*>::isEmpty((QList<QGraphicsItem_*> *)0x9c1c01);
  bVar3 = (bVar2 ^ 0xffU) & 1;
  if (!bVar9) {
    if (bVar3 == 0) {
      resetDirtyItem(in_stack_fffffffffffffd90,(QGraphicsItem *)in_stack_fffffffffffffd88,
                     (bool)in_stack_fffffffffffffd87);
      goto LAB_009c2d47;
    }
    pQVar6 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)&in_RSI->field_0x8);
    bVar9 = pQVar6->graphicsEffect != (QGraphicsEffect *)0x0 || bVar9;
  }
  QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
            ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_> *)
             &in_RSI->field_0x8);
  opacity_00 = QGraphicsItemPrivate::combineOpacityFromParent
                         ((QGraphicsItemPrivate *)in_stack_fffffffffffffd88,
                          (qreal)CONCAT17(in_stack_fffffffffffffd87,
                                          CONCAT16(in_stack_fffffffffffffd86,
                                                   CONCAT15(in_stack_fffffffffffffd85,
                                                            CONCAT14(in_stack_fffffffffffffd84,
                                                                     in_stack_fffffffffffffd80)))));
  pQVar6 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       *)&in_RSI->field_0x8);
  bVar2 = false;
  if (((uint)((ulong)*(undefined8 *)&pQVar6->field_0x160 >> 0x3a) & 1) == 0) {
    bVar2 = QGraphicsItemPrivate::isOpacityNull(opacity_00);
  }
  uVar15 = bVar2;
  if (bVar2 != false) {
    if (bVar3 != 0) {
      QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
                ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                  *)&in_RSI->field_0x8);
      bVar4 = QGraphicsItemPrivate::childrenCombineOpacity
                        ((QGraphicsItemPrivate *)in_stack_fffffffffffffd88);
      if (!bVar4) goto LAB_009c1d2b;
    }
    resetDirtyItem(in_stack_fffffffffffffd90,(QGraphicsItem *)in_stack_fffffffffffffd88,
                   (bool)in_stack_fffffffffffffd87);
    goto LAB_009c2d47;
  }
LAB_009c1d2b:
  pQVar6 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       *)&in_RSI->field_0x8);
  bVar10 = (*(ulong *)&pQVar6->field_0x160 >> 0x35 & 1) != 0;
  pQVar6 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       *)&in_RSI->field_0x8);
  bVar4 = QGraphicsItemPrivate::itemIsUntransformable(pQVar6);
  if ((bVar10) && (!bVar4)) {
    pQVar6 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)&in_RSI->field_0x8);
    (*pQVar6->_vptr_QGraphicsItemPrivate[2])();
  }
  pQVar6 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       *)&in_RSI->field_0x8);
  bVar11 = (*(ulong *)&pQVar6->field_0x160 >> 0x34 & 1) != 0;
  if (((bVar2 != false) || (!bVar9)) || ((bVar1 & 1) != 0)) {
    pQVar6 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)&in_RSI->field_0x8);
    *(ulong *)&pQVar6->field_0x160 = *(ulong *)&pQVar6->field_0x160 & 0xfffffffffdffffff;
    pQVar6 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)&in_RSI->field_0x8);
    *(ulong *)&pQVar6->field_0x160 = *(ulong *)&pQVar6->field_0x160 & 0xffffffff7fffffff;
    if ((bVar2 != false) || (!bVar9)) {
      pQVar6 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                           *)&in_RSI->field_0x8);
      *(ulong *)&pQVar6->field_0x160 = *(ulong *)&pQVar6->field_0x160 & 0xffefffffffffffff;
    }
  }
  if (((((ulong)(in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
                extraPaintEngine & 1) == 0) &&
      (pQVar6 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
                operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                            *)&in_RSI->field_0x8), (*(ulong *)&pQVar6->field_0x160 >> 0x36 & 1) != 0
      )) && (pQVar6 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                      ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                                    *)&in_RSI->field_0x8),
            (*(ulong *)&pQVar6->field_0x160 >> 5 & 1) != 0)) {
    pQVar6 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)&in_RSI->field_0x8);
    if ((*(ulong *)&pQVar6->field_0x160 >> 0x3e & 1) == 0) {
      QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
                ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                  *)&in_RSI->field_0x8);
      (**(code **)(*(long *)in_RSI + 0x18))(local_88);
      QTransform::mapRect((QRectF *)local_68);
      QRectF::operator|=((QRectF *)in_stack_fffffffffffffd88,
                         (QRectF *)
                         CONCAT17(in_stack_fffffffffffffd87,
                                  CONCAT16(in_stack_fffffffffffffd86,
                                           CONCAT15(in_stack_fffffffffffffd85,
                                                    CONCAT14(in_stack_fffffffffffffd84,
                                                             in_stack_fffffffffffffd80)))));
    }
    else {
      (**(code **)(*(long *)in_RSI + 0x18))(local_48);
      pQVar6 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                           *)&in_RSI->field_0x8);
      in_stack_fffffffffffffdb0 = (QGraphicsItem *)QTransform::dx(&pQVar6->sceneTransform);
      pQVar6 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                           *)&in_RSI->field_0x8);
      QTransform::dy(&pQVar6->sceneTransform);
      QRectF::translated((QRectF *)in_stack_fffffffffffffd90,(qreal)in_stack_fffffffffffffd88,
                         (qreal)CONCAT17(in_stack_fffffffffffffd87,
                                         CONCAT16(in_stack_fffffffffffffd86,
                                                  CONCAT15(in_stack_fffffffffffffd85,
                                                           CONCAT14(in_stack_fffffffffffffd84,
                                                                    in_stack_fffffffffffffd80)))));
      QRectF::operator|=((QRectF *)in_stack_fffffffffffffd88,
                         (QRectF *)
                         CONCAT17(in_stack_fffffffffffffd87,
                                  CONCAT16(in_stack_fffffffffffffd86,
                                           CONCAT15(in_stack_fffffffffffffd85,
                                                    CONCAT14(in_stack_fffffffffffffd84,
                                                             in_stack_fffffffffffffd80)))));
    }
  }
  pQVar6 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       *)&in_RSI->field_0x8);
  if (((*(ulong *)&pQVar6->field_0x160 >> 0x19 & 1) != 0) ||
     (pQVar6 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                           *)&in_RSI->field_0x8), (*(ulong *)&pQVar6->field_0x160 >> 0x34 & 1) != 0)
     ) {
    bVar2 = QList<QGraphicsView_*>::isEmpty((QList<QGraphicsView_*> *)0x9c2082);
    local_259 = 1;
    if (!bVar2) {
      local_259 = QObjectPrivate::isSignalConnected
                            ((uint)in_RDI,
                             SUB41(*(undefined4 *)
                                    &(in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                                     super_QWidgetPrivate.extra._M_t.
                                     super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>.
                                     _M_t.
                                     super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>
                                     .super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl,0));
    }
    local_a8 = -NAN;
    local_a0 = -NAN;
    local_98 = -NAN;
    local_90 = -NAN;
    adjustedItemEffectiveBoundingRect
              ((QGraphicsItem *)
               CONCAT17(in_stack_fffffffffffffd87,
                        CONCAT16(in_stack_fffffffffffffd86,
                                 CONCAT15(in_stack_fffffffffffffd85,
                                          CONCAT14(in_stack_fffffffffffffd84,
                                                   in_stack_fffffffffffffd80)))));
    if (((local_259 & 1) != 0) && (!bVar4)) {
      QGraphicsItem::boundingRegionGranularity((QGraphicsItem *)in_stack_fffffffffffffd90);
      bVar2 = qFuzzyIsNull((double)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      if (bVar2) {
        pQVar6 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                 ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                               *)&in_RSI->field_0x8);
        if ((*(ulong *)&pQVar6->field_0x160 >> 0x3e & 1) == 0) {
          local_e8[0].xp = -NAN;
          local_e8[0].yp = -NAN;
          local_e8[0].w = -NAN;
          local_e8[0].h = -NAN;
          QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
          operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                      *)&in_RSI->field_0x8);
          QTransform::mapRect((QRectF *)local_e8);
          bVar2 = QRectF::isEmpty(local_e8);
          if (!bVar2) {
            QGraphicsScene::update(in_stack_fffffffffffffdc8,(QRectF *)in_RDI);
          }
        }
        else {
          pQVar6 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                   ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                                 *)&in_RSI->field_0x8);
          in_stack_fffffffffffffd90 =
               (QGraphicsScenePrivate *)QTransform::dx(&pQVar6->sceneTransform);
          pQVar6 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                   ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                                 *)&in_RSI->field_0x8);
          QTransform::dy(&pQVar6->sceneTransform);
          QRectF::translated((QRectF *)in_stack_fffffffffffffd90,(qreal)in_stack_fffffffffffffd88,
                             (qreal)CONCAT17(in_stack_fffffffffffffd87,
                                             CONCAT16(in_stack_fffffffffffffd86,
                                                      CONCAT15(in_stack_fffffffffffffd85,
                                                               CONCAT14(in_stack_fffffffffffffd84,
                                                                        in_stack_fffffffffffffd80)))
                                            ));
          QGraphicsScene::update(in_stack_fffffffffffffdc8,(QRectF *)in_RDI);
        }
        goto LAB_009c2710;
      }
    }
    local_108.xp = -NAN;
    local_108.yp = -NAN;
    local_108.w = -NAN;
    local_108.h = -NAN;
    QRectF::QRectF(&local_108);
    bVar2 = true;
    local_110.i = (QGraphicsView **)&DAT_aaaaaaaaaaaaaaaa;
    local_110 = QList<QGraphicsView_*>::begin
                          ((QList<QGraphicsView_*> *)
                           CONCAT17(in_stack_fffffffffffffd87,
                                    CONCAT16(in_stack_fffffffffffffd86,
                                             CONCAT15(in_stack_fffffffffffffd85,
                                                      CONCAT14(in_stack_fffffffffffffd84,
                                                               in_stack_fffffffffffffd80)))));
    local_118.i = (QGraphicsView **)&DAT_aaaaaaaaaaaaaaaa;
    local_118 = QList<QGraphicsView_*>::end
                          ((QList<QGraphicsView_*> *)
                           CONCAT17(in_stack_fffffffffffffd87,
                                    CONCAT16(in_stack_fffffffffffffd86,
                                             CONCAT15(in_stack_fffffffffffffd85,
                                                      CONCAT14(in_stack_fffffffffffffd84,
                                                               in_stack_fffffffffffffd80)))));
    while( true ) {
      local_120 = local_118.i;
      bVar4 = QList<QGraphicsView_*>::const_iterator::operator!=(&local_110,local_118);
      if (!bVar4) break;
      QList<QGraphicsView_*>::const_iterator::operator*(&local_110);
      this_00 = QGraphicsView::d_func((QGraphicsView *)0x9c2395);
      QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
                ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                  *)&in_RSI->field_0x8);
      pQVar7 = QHash<QWidget_*,_QRect>::operator[]
                         ((QHash<QWidget_*,_QRect> *)in_stack_fffffffffffffd90,
                          (QWidget **)in_stack_fffffffffffffd88);
      if (((*(uint *)&this_00->field_0x300 >> 0xc & 1) == 0) &&
         (this_00->viewportUpdateMode != NoViewportUpdate)) {
        pQVar6 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                 ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                               *)&in_RSI->field_0x8);
        if ((*(ulong *)&pQVar6->field_0x160 >> 0x34 & 1) != 0) {
          QRect::translate((QRect *)CONCAT17(in_stack_fffffffffffffd87,
                                             CONCAT16(in_stack_fffffffffffffd86,
                                                      CONCAT15(in_stack_fffffffffffffd85,
                                                               CONCAT14(in_stack_fffffffffffffd84,
                                                                        in_stack_fffffffffffffd80)))
                                            ),
                           (QPoint *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
          bVar4 = QGraphicsViewPrivate::updateRect
                            (in_RDI,(QRect *)CONCAT17(bVar16,CONCAT16(uVar15,
                                                  in_stack_fffffffffffffdb8)));
          if (!bVar4) {
            QRect::QRect((QRect *)in_stack_fffffffffffffd88,
                         CONCAT13(in_stack_fffffffffffffd87,
                                  CONCAT12(in_stack_fffffffffffffd86,
                                           CONCAT11(in_stack_fffffffffffffd85,
                                                    in_stack_fffffffffffffd84))),
                         in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,
                         in_stack_fffffffffffffd78);
            pQVar7->x1 = (Representation)(undefined4)local_140;
            pQVar7->y1 = (Representation)local_140._4_4_;
            pQVar7->x2 = (Representation)(undefined4)local_138;
            pQVar7->y2 = (Representation)local_138._4_4_;
          }
        }
        pQVar6 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                 ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                               *)&in_RSI->field_0x8);
        if (((*(ulong *)&pQVar6->field_0x160 >> 0x19 & 1) != 0) &&
           ((((pQVar6 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                        ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                                      *)&in_RSI->field_0x8),
              (*(ulong *)&pQVar6->field_0x160 >> 0x34 & 1) != 0 ||
              (iVar5 = QRect::x((QRect *)0x9c2540), iVar5 != -1)) ||
             (iVar5 = QRect::y((QRect *)0x9c2552), iVar5 != -1)) ||
            ((iVar5 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffd7c,
                                                     in_stack_fffffffffffffd78)), iVar5 != -1 ||
             (iVar5 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffd7c,
                                                      in_stack_fffffffffffffd78)), iVar5 != -1))))))
        {
          if (bVar2) {
            local_108.xp = local_a8;
            local_108.yp = local_a0;
            local_108.w = local_98;
            local_108.h = local_90;
            pQVar6 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                     ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                                   *)&in_RSI->field_0x8);
            if ((*(ulong *)&pQVar6->field_0x160 >> 0x1f & 1) == 0) {
              QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
              operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                          *)&in_RSI->field_0x8);
              _q_adjustRect((QRectF *)0x9c2610);
              QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
              operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                          *)&in_RSI->field_0x8);
              QRectF::operator&=((QRectF *)in_stack_fffffffffffffd88,
                                 (QRectF *)
                                 CONCAT17(in_stack_fffffffffffffd87,
                                          CONCAT16(in_stack_fffffffffffffd86,
                                                   CONCAT15(in_stack_fffffffffffffd85,
                                                            CONCAT14(in_stack_fffffffffffffd84,
                                                                     in_stack_fffffffffffffd80)))));
            }
            bVar2 = false;
          }
          bVar4 = QRectF::isEmpty(&local_108);
          if (!bVar4) {
            QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::data
                      ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                        *)&in_RSI->field_0x8);
            bVar4 = updateHelper(in_stack_fffffffffffffdf0,
                                 (QGraphicsItemPrivate *)
                                 CONCAT17(in_stack_fffffffffffffdef,
                                          CONCAT16(in_stack_fffffffffffffdee,
                                                   CONCAT15(in_stack_fffffffffffffded,
                                                            in_stack_fffffffffffffde8))),
                                 in_stack_fffffffffffffde0,
                                 SUB81((ulong)in_stack_fffffffffffffdd8 >> 0x38,0));
            in_stack_fffffffffffffd88 = this_00;
            if ((!bVar4) &&
               (pQVar6 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                                       *)&in_RSI->field_0x8), in_stack_fffffffffffffd88 = this_00,
               (*(ulong *)&pQVar6->field_0x160 >> 0x34 & 1) != 0)) {
              QRect::QRect((QRect *)this_00,
                           CONCAT13(in_stack_fffffffffffffd87,
                                    CONCAT12(in_stack_fffffffffffffd86,
                                             CONCAT11(in_stack_fffffffffffffd85,
                                                      in_stack_fffffffffffffd84))),
                           in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,
                           in_stack_fffffffffffffd78);
              pQVar7->x1 = (Representation)(undefined4)local_150;
              pQVar7->y1 = (Representation)local_150._4_4_;
              pQVar7->x2 = (Representation)(undefined4)local_148;
              pQVar7->y2 = (Representation)local_148._4_4_;
              in_stack_fffffffffffffd88 = this_00;
            }
          }
        }
      }
      else {
        QRect::QRect((QRect *)in_stack_fffffffffffffd88,
                     CONCAT13(in_stack_fffffffffffffd87,
                              CONCAT12(in_stack_fffffffffffffd86,
                                       CONCAT11(in_stack_fffffffffffffd85,in_stack_fffffffffffffd84)
                                      )),in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,
                     in_stack_fffffffffffffd78);
        pQVar7->x1 = (Representation)(undefined4)local_130;
        pQVar7->y1 = (Representation)local_130._4_4_;
        pQVar7->x2 = (Representation)(undefined4)local_128;
        pQVar7->y2 = (Representation)local_128._4_4_;
      }
      QList<QGraphicsView_*>::const_iterator::operator++(&local_110);
    }
  }
LAB_009c2710:
  if ((bVar3 == 0) ||
     (pQVar6 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                           *)&in_RSI->field_0x8), (*(ulong *)&pQVar6->field_0x160 >> 0x1a & 1) == 0)
     ) {
    if (bVar10) {
      QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
                ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                  *)&in_RSI->field_0x8);
      QGraphicsItemPrivate::invalidateChildrenSceneTransform
                ((QGraphicsItemPrivate *)in_stack_fffffffffffffd90);
    }
  }
  else {
    pQVar6 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)&in_RSI->field_0x8);
    bVar2 = true;
    if ((*(ulong *)&pQVar6->field_0x160 & 0x1000000000) == 0) {
      pQVar6 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                           *)&in_RSI->field_0x8);
      bVar2 = (*(ulong *)&pQVar6->field_0x160 & 0x8000000000000) != 0;
    }
    uVar14 = !bVar9 && bVar11;
    in_stack_fffffffffffffd87 = bVar2;
    if ((bVar2 != false) && (bVar9 || !bVar11)) {
      local_158.i = (QGraphicsView **)&DAT_aaaaaaaaaaaaaaaa;
      local_158 = QList<QGraphicsView_*>::begin
                            ((QList<QGraphicsView_*> *)
                             CONCAT17(bVar2,CONCAT16(uVar14,CONCAT15(in_stack_fffffffffffffd85,
                                                                     CONCAT14(
                                                  in_stack_fffffffffffffd84,
                                                  in_stack_fffffffffffffd80)))));
      local_160.i = (QGraphicsView **)&DAT_aaaaaaaaaaaaaaaa;
      local_160 = QList<QGraphicsView_*>::end
                            ((QList<QGraphicsView_*> *)
                             CONCAT17(in_stack_fffffffffffffd87,
                                      CONCAT16(uVar14,CONCAT15(in_stack_fffffffffffffd85,
                                                               CONCAT14(in_stack_fffffffffffffd84,
                                                                        in_stack_fffffffffffffd80)))
                                     ));
      while( true ) {
        local_168 = local_160.i;
        bVar9 = QList<QGraphicsView_*>::const_iterator::operator!=(&local_158,local_160);
        if (!bVar9) break;
        QList<QGraphicsView_*>::const_iterator::operator*(&local_158);
        QGraphicsView::d_func((QGraphicsView *)0x9c28b2);
        QGraphicsViewPrivate::setUpdateClip
                  ((QGraphicsViewPrivate *)
                   CONCAT17(bVar16,CONCAT16(uVar15,in_stack_fffffffffffffdb8)),
                   in_stack_fffffffffffffdb0);
        QList<QGraphicsView_*>::const_iterator::operator++(&local_158);
      }
    }
    if ((bVar1 & 1) == 0) {
      pQVar6 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                           *)&in_RSI->field_0x8);
      in_stack_fffffffffffffd85 = 0;
      bVar1 = 0;
      if ((*(ulong *)&pQVar6->field_0x160 >> 0x1f & 1) != 0) {
        in_stack_fffffffffffffd85 = bVar2;
        bVar1 = bVar2;
      }
    }
    pQVar6 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)&in_RSI->field_0x8);
    bVar3 = (*(ulong *)&pQVar6->field_0x160 >> 0x1e & 1) != 0;
    pQVar6 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)&in_RSI->field_0x8);
    bVar12 = (*(ulong *)&pQVar6->field_0x160 >> 0x39 & 1) != 0;
    pQVar6 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)&in_RSI->field_0x8);
    bVar13 = (*(ulong *)&pQVar6->field_0x160 >> 0x3a & 1) != 0;
    QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
              ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_> *
               )&in_RSI->field_0x8);
    local_170.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
    local_170 = QList<QGraphicsItem_*>::begin
                          ((QList<QGraphicsItem_*> *)
                           CONCAT17(in_stack_fffffffffffffd87,
                                    CONCAT16(uVar14,CONCAT15(in_stack_fffffffffffffd85,
                                                             CONCAT14(in_stack_fffffffffffffd84,
                                                                      in_stack_fffffffffffffd80)))))
    ;
    local_178.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
    local_178 = QList<QGraphicsItem_*>::end
                          ((QList<QGraphicsItem_*> *)
                           CONCAT17(in_stack_fffffffffffffd87,
                                    CONCAT16(uVar14,CONCAT15(in_stack_fffffffffffffd85,
                                                             CONCAT14(in_stack_fffffffffffffd84,
                                                                      in_stack_fffffffffffffd80)))))
    ;
    while( true ) {
      local_180 = local_178.i;
      bVar9 = QList<QGraphicsItem_*>::const_iterator::operator!=(&local_170,local_178);
      if (!bVar9) break;
      ppQVar8 = QList<QGraphicsItem_*>::const_iterator::operator*(&local_170);
      pQVar17 = *ppQVar8;
      if (bVar10) {
        pQVar6 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                 ::operator->(&pQVar17->d_ptr);
        *(ulong *)&pQVar6->field_0x160 =
             *(ulong *)&pQVar6->field_0x160 & 0xffdfffffffffffff | 0x20000000000000;
      }
      if (bVar11) {
        pQVar6 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                 ::operator->(&pQVar17->d_ptr);
        *(ulong *)&pQVar6->field_0x160 =
             *(ulong *)&pQVar6->field_0x160 & 0xffefffffffffffff | 0x10000000000000;
      }
      if ((bVar12 & 1) != 0) {
        pQVar6 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                 ::operator->(&pQVar17->d_ptr);
        *(ulong *)&pQVar6->field_0x160 =
             *(ulong *)&pQVar6->field_0x160 & 0xfdffffffffffffff | 0x200000000000000;
      }
      if ((bVar13 & 1) != 0) {
        pQVar6 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                 ::operator->(&pQVar17->d_ptr);
        *(ulong *)&pQVar6->field_0x160 =
             *(ulong *)&pQVar6->field_0x160 & 0xfbffffffffffffff | 0x400000000000000;
      }
      if ((bVar3 & 1) != 0) {
        pQVar6 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                 ::operator->(&pQVar17->d_ptr);
        *(ulong *)&pQVar6->field_0x160 =
             *(ulong *)&pQVar6->field_0x160 & 0xfffffffffdffffff | 0x2000000;
        pQVar6 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                 ::operator->(&pQVar17->d_ptr);
        *(ulong *)&pQVar6->field_0x160 =
             *(ulong *)&pQVar6->field_0x160 & 0xffffffff7fffffff | 0x80000000;
        pQVar6 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                 ::operator->(&pQVar17->d_ptr);
        *(ulong *)&pQVar6->field_0x160 =
             *(ulong *)&pQVar6->field_0x160 & 0xfffffffffbffffff | 0x4000000;
        pQVar6 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                 ::operator->(&pQVar17->d_ptr);
        *(ulong *)&pQVar6->field_0x160 =
             *(ulong *)&pQVar6->field_0x160 & 0xffffffffbfffffff | 0x40000000;
      }
      processDirtyItemsRecursive
                (in_RSI,(QGraphicsItem *)CONCAT17(bVar1,in_stack_fffffffffffffe50),
                 SUB81((ulong)in_XMM0_Qa >> 0x38,0),(qreal)parentOpacity_00);
      QList<QGraphicsItem_*>::const_iterator::operator++(&local_170);
    }
    if (bVar2 != false) {
      local_188.i = (QGraphicsView **)&DAT_aaaaaaaaaaaaaaaa;
      local_188 = QList<QGraphicsView_*>::begin
                            ((QList<QGraphicsView_*> *)
                             CONCAT17(in_stack_fffffffffffffd87,
                                      CONCAT16(uVar14,CONCAT15(in_stack_fffffffffffffd85,
                                                               CONCAT14(in_stack_fffffffffffffd84,
                                                                        in_stack_fffffffffffffd80)))
                                     ));
      o = QList<QGraphicsView_*>::end
                    ((QList<QGraphicsView_*> *)
                     CONCAT17(in_stack_fffffffffffffd87,
                              CONCAT16(uVar14,CONCAT15(in_stack_fffffffffffffd85,
                                                       CONCAT14(in_stack_fffffffffffffd84,
                                                                in_stack_fffffffffffffd80)))));
      while (bVar9 = QList<QGraphicsView_*>::const_iterator::operator!=(&local_188,o), bVar9) {
        QList<QGraphicsView_*>::const_iterator::operator*(&local_188);
        QGraphicsView::d_func((QGraphicsView *)0x9c2cef);
        QGraphicsViewPrivate::setUpdateClip
                  ((QGraphicsViewPrivate *)
                   CONCAT17(bVar16,CONCAT16(uVar15,in_stack_fffffffffffffdb8)),
                   in_stack_fffffffffffffdb0);
        QList<QGraphicsView_*>::const_iterator::operator++(&local_188);
      }
    }
  }
  resetDirtyItem(in_stack_fffffffffffffd90,(QGraphicsItem *)in_stack_fffffffffffffd88,
                 (bool)in_stack_fffffffffffffd87);
LAB_009c2d47:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::processDirtyItemsRecursive(QGraphicsItem *item, bool dirtyAncestorContainsChildren,
                                                       qreal parentOpacity)
{
    Q_Q(QGraphicsScene);
    Q_ASSERT(item);
    Q_ASSERT(!updateAll);

    if (!item->d_ptr->dirty && !item->d_ptr->dirtyChildren) {
        resetDirtyItem(item);
        return;
    }

    const bool itemIsHidden = !item->d_ptr->ignoreVisible && !item->d_ptr->visible;
    if (itemIsHidden) {
        resetDirtyItem(item, /*recursive=*/true);
        return;
    }

    bool itemHasContents = !(item->d_ptr->flags & QGraphicsItem::ItemHasNoContents);
    const bool itemHasChildren = !item->d_ptr->children.isEmpty();
    if (!itemHasContents) {
        if (!itemHasChildren) {
            resetDirtyItem(item);
            return; // Item has neither contents nor children!(?)
        }
        if (item->d_ptr->graphicsEffect)
            itemHasContents = true;
    }

    const qreal opacity = item->d_ptr->combineOpacityFromParent(parentOpacity);
    const bool itemIsFullyTransparent = !item->d_ptr->ignoreOpacity
                                        && QGraphicsItemPrivate::isOpacityNull(opacity);
    if (itemIsFullyTransparent && (!itemHasChildren || item->d_ptr->childrenCombineOpacity())) {
        resetDirtyItem(item, /*recursive=*/itemHasChildren);
        return;
    }

    bool wasDirtyParentSceneTransform = item->d_ptr->dirtySceneTransform;
    const bool itemIsUntransformable = item->d_ptr->itemIsUntransformable();
    if (wasDirtyParentSceneTransform && !itemIsUntransformable) {
        item->d_ptr->updateSceneTransformFromParent();
        Q_ASSERT(!item->d_ptr->dirtySceneTransform);
    }

    const bool wasDirtyParentViewBoundingRects = item->d_ptr->paintedViewBoundingRectsNeedRepaint;
    if (itemIsFullyTransparent || !itemHasContents || dirtyAncestorContainsChildren) {
        // Make sure we don't process invisible items or items with no content.
        item->d_ptr->dirty = 0;
        item->d_ptr->fullUpdatePending = 0;
        // Might have a dirty view bounding rect otherwise.
        if (itemIsFullyTransparent || !itemHasContents)
            item->d_ptr->paintedViewBoundingRectsNeedRepaint = 0;
    }

    if (!hasSceneRect && item->d_ptr->geometryChanged && item->d_ptr->visible) {
        // Update growingItemsBoundingRect.
        if (item->d_ptr->sceneTransformTranslateOnly) {
            growingItemsBoundingRect |= item->boundingRect().translated(item->d_ptr->sceneTransform.dx(),
                                                                        item->d_ptr->sceneTransform.dy());
        } else {
            growingItemsBoundingRect |= item->d_ptr->sceneTransform.mapRect(item->boundingRect());
        }
    }

    // Process item.
    if (item->d_ptr->dirty || item->d_ptr->paintedViewBoundingRectsNeedRepaint) {
        const bool useCompatUpdate = views.isEmpty() || isSignalConnected(changedSignalIndex);
        const QRectF itemBoundingRect = adjustedItemEffectiveBoundingRect(item);

        if (useCompatUpdate && !itemIsUntransformable && qFuzzyIsNull(item->boundingRegionGranularity())) {
            // This block of code is kept for compatibility. Since 4.5, by default
            // QGraphicsView does not connect the signal and we use the below
            // method of delivering updates.
            if (item->d_ptr->sceneTransformTranslateOnly) {
                q->update(itemBoundingRect.translated(item->d_ptr->sceneTransform.dx(),
                                                      item->d_ptr->sceneTransform.dy()));
            } else {
                QRectF rect = item->d_ptr->sceneTransform.mapRect(itemBoundingRect);
                if (!rect.isEmpty())
                    q->update(rect);
            }
        } else {
            QRectF dirtyRect;
            bool uninitializedDirtyRect = true;

            for (auto view : std::as_const(views)) {
                QGraphicsViewPrivate *viewPrivate = view->d_func();
                QRect &paintedViewBoundingRect = item->d_ptr->paintedViewBoundingRects[viewPrivate->viewport];
                if (viewPrivate->fullUpdatePending
                    || viewPrivate->viewportUpdateMode == QGraphicsView::NoViewportUpdate) {
                    // Okay, if we have a full update pending or no viewport update, this item's
                    // paintedViewBoundingRect  will be updated correctly in the next paintEvent if
                    // it is inside the viewport, but for now we can pretend that it is outside.
                    paintedViewBoundingRect = QRect(-1, -1, -1, -1);
                    continue;
                }

                if (item->d_ptr->paintedViewBoundingRectsNeedRepaint) {
                    paintedViewBoundingRect.translate(viewPrivate->dirtyScrollOffset);
                    if (!viewPrivate->updateRect(paintedViewBoundingRect))
                        paintedViewBoundingRect = QRect(-1, -1, -1, -1); // Outside viewport.
                }

                if (!item->d_ptr->dirty)
                    continue;

                if (!item->d_ptr->paintedViewBoundingRectsNeedRepaint
                    && paintedViewBoundingRect.x() == -1 && paintedViewBoundingRect.y() == -1
                    && paintedViewBoundingRect.width() == -1 && paintedViewBoundingRect.height() == -1) {
                    continue; // Outside viewport.
                }

                if (uninitializedDirtyRect) {
                    dirtyRect = itemBoundingRect;
                    if (!item->d_ptr->fullUpdatePending) {
                        _q_adjustRect(&item->d_ptr->needsRepaint);
                        dirtyRect &= item->d_ptr->needsRepaint;
                    }
                    uninitializedDirtyRect = false;
                }

                if (dirtyRect.isEmpty())
                    continue; // Discard updates outside the bounding rect.

                if (!updateHelper(viewPrivate, item->d_ptr.data(), dirtyRect, itemIsUntransformable)
                    && item->d_ptr->paintedViewBoundingRectsNeedRepaint) {
                    paintedViewBoundingRect = QRect(-1, -1, -1, -1); // Outside viewport.
                }
            }
        }
    }

    // Process children.
    if (itemHasChildren && item->d_ptr->dirtyChildren) {
        const bool itemClipsChildrenToShape = item->d_ptr->flags & QGraphicsItem::ItemClipsChildrenToShape
                                              || item->d_ptr->flags & QGraphicsItem::ItemContainsChildrenInShape;
        // Items with no content are threated as 'dummy' items which means they are never drawn and
        // 'processed', so the painted view bounding rect is never up-to-date. This means that whenever
        // such an item changes geometry, its children have to take care of the update regardless
        // of whether the item clips children to shape or not.
        const bool bypassUpdateClip = !itemHasContents && wasDirtyParentViewBoundingRects;
        if (itemClipsChildrenToShape && !bypassUpdateClip) {
            // Make sure child updates are clipped to the item's bounding rect.
            for (auto view : std::as_const(views))
                view->d_func()->setUpdateClip(item);
        }
        if (!dirtyAncestorContainsChildren) {
            dirtyAncestorContainsChildren = item->d_ptr->fullUpdatePending
                                            && itemClipsChildrenToShape;
        }
        const bool allChildrenDirty = item->d_ptr->allChildrenDirty;
        const bool parentIgnoresVisible = item->d_ptr->ignoreVisible;
        const bool parentIgnoresOpacity = item->d_ptr->ignoreOpacity;
        for (auto child : std::as_const(item->d_ptr->children)) {
            if (wasDirtyParentSceneTransform)
                child->d_ptr->dirtySceneTransform = 1;
            if (wasDirtyParentViewBoundingRects)
                child->d_ptr->paintedViewBoundingRectsNeedRepaint = 1;
            if (parentIgnoresVisible)
                child->d_ptr->ignoreVisible = 1;
            if (parentIgnoresOpacity)
                child->d_ptr->ignoreOpacity = 1;
            if (allChildrenDirty) {
                child->d_ptr->dirty = 1;
                child->d_ptr->fullUpdatePending = 1;
                child->d_ptr->dirtyChildren = 1;
                child->d_ptr->allChildrenDirty = 1;
            }
            processDirtyItemsRecursive(child, dirtyAncestorContainsChildren, opacity);
        }

        if (itemClipsChildrenToShape) {
            // Reset updateClip.
            for (auto view : std::as_const(views))
                view->d_func()->setUpdateClip(nullptr);
        }
    } else if (wasDirtyParentSceneTransform) {
        item->d_ptr->invalidateChildrenSceneTransform();
    }

    resetDirtyItem(item);
}